

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_socket.c
# Opt level: O1

int mk_socket_set_tcp_defer_accept(int sockfd)

{
  uint in_EAX;
  int iVar1;
  int timeout;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  iVar1 = setsockopt(sockfd,6,9,(void *)((long)&uStack_8 + 4),4);
  return iVar1;
}

Assistant:

int mk_socket_set_tcp_defer_accept(int sockfd)
{
#if defined (__linux__)
    int timeout = 0;

    return setsockopt(sockfd, IPPROTO_TCP, TCP_DEFER_ACCEPT, &timeout, sizeof(int));
#else
    (void) sockfd;
    return -1;
#endif
}